

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O2

CodeLocation __thiscall soul::CodeLocation::createFromSourceFile(CodeLocation *this,SourceFile *f)

{
  UTF8Reader extraout_RDX;
  CodeLocation CVar1;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)f);
  std::__cxx11::string::string((string *)&local_50,(string *)&f->content);
  createFromString(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  CVar1.location.data = extraout_RDX.data;
  CVar1.sourceCode.object = (SourceCodeText *)this;
  return CVar1;
}

Assistant:

CodeLocation CodeLocation::createFromSourceFile (const SourceFile& f)
{
    return createFromString (f.filename, f.content);
}